

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O1

void * ym2610_init(void *param,UINT32 clock,UINT32 rate,FM_TIMERHANDLER timer_handler,
                  FM_IRQHANDLER IRQHandler)

{
  uint uVar1;
  void *pvVar2;
  long lVar3;
  YM2610 *F2610;
  uint uVar4;
  
  pvVar2 = calloc(1,0x5410);
  if (pvVar2 == (void *)0x0) {
    pvVar2 = (void *)0x0;
  }
  else {
    init_tables();
    *(void **)((long)pvVar2 + 0x210) = param;
    *(undefined1 *)((long)pvVar2 + 0x208) = 0x37;
    *(long *)((long)pvVar2 + 0x6a0) = (long)pvVar2 + 0x4778;
    *(UINT32 *)((long)pvVar2 + 0x218) = clock;
    *(UINT32 *)((long)pvVar2 + 0x21c) = rate;
    uVar4 = rate - clock / 0x90;
    uVar1 = -uVar4;
    if (0 < (int)uVar4) {
      uVar1 = uVar4;
    }
    *(bool *)((long)pvVar2 + 0x209) = uVar1 < 3;
    *(FM_TIMERHANDLER *)((long)pvVar2 + 0x648) = timer_handler;
    *(FM_IRQHANDLER *)((long)pvVar2 + 0x650) = IRQHandler;
    *(code **)((long)pvVar2 + 0x658) = ssgdummy_set_clock;
    *(code **)((long)pvVar2 + 0x660) = ssgdummy_write;
    *(code **)((long)pvVar2 + 0x668) = ssgdummy_read;
    *(code **)((long)pvVar2 + 0x670) = ssgdummy_reset;
    *(undefined8 *)((long)pvVar2 + 0x678) = 0;
    *(undefined8 *)((long)pvVar2 + 0x5110) = 0;
    *(undefined4 *)((long)pvVar2 + 0x5118) = 0;
    *(undefined8 *)((long)pvVar2 + 0x4750) = 0;
    *(undefined8 *)((long)pvVar2 + 0x4758) = 0;
    *(long *)((long)pvVar2 + 0x5368) = (long)pvVar2 + 0x4760;
    *(undefined8 *)((long)pvVar2 + 0x5370) = 0;
    *(undefined8 *)((long)pvVar2 + 0x5390) = 0;
    *(code **)((long)pvVar2 + 0x53d8) = YM2610_deltat_status_set;
    *(code **)((long)pvVar2 + 0x53e0) = YM2610_deltat_status_reset;
    *(void **)((long)pvVar2 + 0x53e8) = pvVar2;
    *(undefined1 *)((long)pvVar2 + 0x53f0) = 0x80;
    YM_DELTAT_ADPCM_Init
              ((YM_DELTAT *)((long)pvVar2 + 0x5368),1,8,(INT32 *)((long)pvVar2 + 0x473c),0x800000);
    Init_ADPCMATable();
    lVar3 = 0x4908;
    do {
      *(undefined1 *)((long)pvVar2 + lVar3) = 0;
      lVar3 = lVar3 + 0x198;
    } while (lVar3 != 0x5298);
    lVar3 = 0x5158;
    do {
      *(undefined1 *)((long)pvVar2 + lVar3) = 0;
      lVar3 = lVar3 + 0x40;
    } while (lVar3 != 0x52d8);
    *(undefined1 *)((long)pvVar2 + 0x5408) = 0;
  }
  return pvVar2;
}

Assistant:

void *ym2610_init(void *param, UINT32 clock, UINT32 rate,
				FM_TIMERHANDLER timer_handler,FM_IRQHANDLER IRQHandler)
{
	YM2610 *F2610;

	/* allocate extend state space */
	F2610 = (YM2610 *)calloc(1,sizeof(YM2610));
	if( F2610==NULL)
		return NULL;

	/* allocate total level table (128kb space) */
	init_tables();

	/* FM */
	F2610->OPN.ST.param = param;
	F2610->OPN.type = TYPE_YM2610;
	F2610->OPN.P_CH = F2610->CH;
	F2610->OPN.ST.clock = clock;
	F2610->OPN.ST.rate = rate;
	OPNCheckNativeSampleRate(&F2610->OPN);
	/* Extend handler */
	F2610->OPN.ST.timer_handler = timer_handler;
	F2610->OPN.ST.IRQ_Handler   = IRQHandler;
	OPNLinkSSG(&F2610->OPN, NULL, NULL);
	OPNSetSmplRateChgCallback(&F2610->OPN, NULL, NULL);
	/* ADPCM */
	F2610->pcmbuf   = NULL;
	F2610->pcm_size = 0x00;
	/* DELTA-T */
	F2610->deltaT.logger = &F2610->OPN.logger;
	F2610->deltaT.memory = NULL;
	F2610->deltaT.memory_size = 0x00;
	F2610->deltaT.memory_mask = 0x00;

	F2610->deltaT.status_set_handler = YM2610_deltat_status_set;
	F2610->deltaT.status_reset_handler = YM2610_deltat_status_reset;
	F2610->deltaT.status_change_which_chip = F2610;
	F2610->deltaT.status_change_EOS_bit = 0x80; /* status flag: set bit7 on End Of Sample */

	YM_DELTAT_ADPCM_Init(&F2610->deltaT,YM_DELTAT_EMULATION_MODE_YM2610,8,F2610->OPN.out_delta,1<<23);

	Init_ADPCMATable();

	ym2610_set_mute_mask(F2610, 0x00);

	return F2610;
}